

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  EVP_MD_CTX *out;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  EVP_MD_CTX *in;
  bool bVar11;
  uchar seq [8];
  uchar adjusted_iv [16];
  uchar newkey [32];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (type < 0x20) {
    if (type == 6) {
      uVar2 = EVP_CIPHER_CTX_get_key_length(ctx);
      iVar1 = RAND_priv_bytes(ptr,uVar2);
      if (0 < iVar1) {
        return 1;
      }
      iVar10 = 0x7e;
      iVar1 = 1099;
    }
    else {
      if (type == 8) {
        lVar4 = EVP_CIPHER_CTX_get_cipher_data(ptr);
        pcVar7 = (char *)EVP_CIPHER_CTX_get_cipher_data(ctx);
        if (*pcVar7 != '\x06') {
          return -1;
        }
        in = *(EVP_MD_CTX **)(pcVar7 + 0x1c8);
        out = *(EVP_MD_CTX **)(lVar4 + 0x1c8);
        if (in == out) {
          out = (EVP_MD_CTX *)EVP_MD_CTX_new();
          *(EVP_MD_CTX **)(lVar4 + 0x1c8) = out;
          if (out == (EVP_MD_CTX *)0x0) {
            iVar10 = 0xc0100;
            iVar1 = 0x4bc;
            goto LAB_0011dcfd;
          }
          in = *(EVP_MD_CTX **)(pcVar7 + 0x1c8);
        }
        iVar1 = EVP_MD_CTX_copy(out,in);
        return iVar1;
      }
LAB_0011dc72:
      iVar10 = 0x82;
      iVar1 = 0x4c4;
    }
    ERR_GOST_error(0x6f,iVar10,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_grasshopper_cipher.c"
                   ,iVar1);
LAB_0011dc8d:
    iVar1 = -1;
  }
  else {
    if (type == 0x20) {
      pcVar7 = (char *)EVP_CIPHER_CTX_get_cipher_data(ctx);
      if (*pcVar7 == '\x05') {
        if (arg == 0) goto LAB_0011dc8d;
      }
      else if (arg == 0 || *pcVar7 != '\x06') {
        return -1;
      }
      if ((arg & 0xfU) != 0) {
        return -1;
      }
      *(int *)(pcVar7 + 0x1a8) = arg;
    }
    else {
      if (type == 0x28) {
        pcVar7 = (char *)EVP_CIPHER_CTX_get_cipher_data(ctx);
        if (*pcVar7 != '\x06') {
          return -1;
        }
        iVar1 = gost2015_process_unprotected_attributes
                          ((stack_st_X509_ATTRIBUTE *)ptr,arg,0x10,(uchar *)(pcVar7 + 0x1b4));
        return iVar1;
      }
      if (type != 0x2a) goto LAB_0011dc72;
      uVar3 = EVP_CIPHER_CTX_get0_cipher(ctx);
      iVar1 = EVP_CIPHER_get_mode(uVar3);
      if (iVar1 != 5) {
        return -1;
      }
      lVar4 = EVP_CIPHER_CTX_get_cipher_data(ctx);
      local_60 = *ptr;
      iVar1 = decrement_sequence((uchar *)&local_60,arg);
      if (iVar1 == 0) {
        iVar10 = 0x68;
        iVar1 = 0x477;
LAB_0011dcfd:
        ERR_GOST_error(0x6f,iVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_grasshopper_cipher.c"
                       ,iVar1);
        return -1;
      }
      iVar1 = gost_tlstree(0x3f7,(uchar *)(lVar4 + 8),(uchar *)&local_48,(uchar *)&local_60);
      if (iVar1 < 1) goto LAB_0011dc8d;
      local_58 = 0;
      uStack_50 = 0;
      puVar5 = (undefined8 *)EVP_CIPHER_CTX_original_iv(ctx);
      local_58 = *puVar5;
      uVar8 = 0;
      lVar6 = 7;
      do {
        uVar9 = (uint)*(byte *)((long)&local_60 + lVar6) +
                *(byte *)((long)&local_58 + lVar6) + uVar8;
        uVar8 = (uint)(0xff < uVar9);
        *(char *)((long)&local_58 + lVar6) = (char)uVar9;
        bVar11 = lVar6 != 0;
        lVar6 = lVar6 + -1;
      } while (bVar11);
      EVP_CIPHER_CTX_set_num(ctx,0);
      puVar5 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(ctx);
      *puVar5 = local_58;
      puVar5[1] = uStack_50;
      *(undefined8 *)(lVar4 + 0x28) = local_48;
      *(undefined8 *)(lVar4 + 0x30) = uStack_40;
      *(undefined8 *)(lVar4 + 0x38) = local_38;
      *(undefined8 *)(lVar4 + 0x40) = uStack_30;
      grasshopper_set_encrypt_key
                ((grasshopper_round_keys_t *)(lVar4 + 0x48),(grasshopper_key_t *)(lVar4 + 0x28));
      grasshopper_set_decrypt_key
                ((grasshopper_round_keys_t *)(lVar4 + 0xe8),(grasshopper_key_t *)(lVar4 + 0x28));
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int gost_grasshopper_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:{
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
        }
    case EVP_CTRL_KEY_MESH:{
            gost_grasshopper_cipher_ctx_ctr *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);
            if ((c->c.type != GRASSHOPPER_CIPHER_CTRACPKM &&
                c->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
                || (arg == 0)
               || (arg % GRASSHOPPER_BLOCK_SIZE))
                return -1;
            c->section_size = arg;
            break;
        }
    case EVP_CTRL_TLSTREE:
        {
          unsigned char newkey[32];
          int mode = EVP_CIPHER_CTX_mode(ctx);
          gost_grasshopper_cipher_ctx_ctr *ctr_ctx = NULL;
          gost_grasshopper_cipher_ctx *c = NULL;

          unsigned char adjusted_iv[16];
          unsigned char seq[8];
          int j, carry, decrement_arg;
          if (mode != EVP_CIPH_CTR_MODE)
              return -1;

          ctr_ctx = (gost_grasshopper_cipher_ctx_ctr *)
              EVP_CIPHER_CTX_get_cipher_data(ctx);
          c = &(ctr_ctx->c);

          /*
           * 'arg' parameter indicates what we should do with sequence value.
           * 
           * When function called, seq is incremented after MAC calculation.
           * In ETM mode, we use seq 'as is' in the ctrl-function (arg = 0)
           * Otherwise we have to decrease it in the implementation (arg = 1).
           */
          memcpy(seq, ptr, 8);
          decrement_arg = arg;
          if (!decrement_sequence(seq, decrement_arg))
          {
              GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, GOST_R_CTRL_CALL_FAILED);
              return -1;
          }

          if (gost_tlstree(NID_grasshopper_cbc, c->master_key.k.b, newkey,
                (const unsigned char *)seq) > 0) {
            memset(adjusted_iv, 0, 16);
            memcpy(adjusted_iv, EVP_CIPHER_CTX_original_iv(ctx), 8);
            for(j=7,carry=0; j>=0; j--)
            {
              int adj_byte = adjusted_iv[j]+seq[j]+carry;
              carry = (adj_byte > 255) ? 1 : 0;
              adjusted_iv[j] = adj_byte & 0xFF;
            }
            EVP_CIPHER_CTX_set_num(ctx, 0);
            memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), adjusted_iv, 16);

            gost_grasshopper_cipher_key(c, newkey);
            return 1;
          }
        }
        return -1;
#if 0
    case EVP_CTRL_AEAD_GET_TAG:
    case EVP_CTRL_AEAD_SET_TAG:
        {
            int taglen = arg;
            unsigned char *tag = ptr;

            gost_grasshopper_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
            if (c->c.type != GRASSHOPPER_CIPHER_MGM)
                return -1;

            if (taglen > KUZNYECHIK_MAC_MAX_SIZE) {
                CRYPTOCOMerr(CRYPTOCOM_F_GOST_GRASSHOPPER_CIPHER_CTL,
                        CRYPTOCOM_R_INVALID_TAG_LENGTH);
                return -1;
            }

            if (type == EVP_CTRL_AEAD_GET_TAG)
                memcpy(tag, c->final_tag, taglen);
            else
                memcpy(c->final_tag, tag, taglen);

            return 1;
        }
#endif
    case EVP_CTRL_PROCESS_UNPROTECTED:
    {
      STACK_OF(X509_ATTRIBUTE) *x = ptr;
      gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);

      if (c->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
        return -1;

      return gost2015_process_unprotected_attributes(x, arg, KUZNYECHIK_MAC_MAX_SIZE, c->tag);
    }
    case EVP_CTRL_COPY: {
        EVP_CIPHER_CTX *out = ptr;

        gost_grasshopper_cipher_ctx_ctr *out_cctx = EVP_CIPHER_CTX_get_cipher_data(out);
        gost_grasshopper_cipher_ctx_ctr *in_cctx  = EVP_CIPHER_CTX_get_cipher_data(ctx);

        if (in_cctx->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
            return -1;

        if (in_cctx->omac_ctx == out_cctx->omac_ctx) {
            out_cctx->omac_ctx = EVP_MD_CTX_new();
            if (out_cctx->omac_ctx == NULL) {
                GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, ERR_R_MALLOC_FAILURE);
                return -1;
            }
        }
        return EVP_MD_CTX_copy(out_cctx->omac_ctx, in_cctx->omac_ctx);
    }
    default:
        GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL,
                GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}